

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  bool bVar2;
  REF_NODE pRVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  uint uVar7;
  uint uVar8;
  REF_INT RVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  int cell_edge;
  REF_NODE ref_node;
  int cell_edge_00;
  long lVar15;
  uint local_198;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_DBL volume;
  ulong local_180;
  ulong local_178;
  REF_NODE local_170;
  REF_INT new_nodes [27];
  void *local_f8;
  REF_INT e3;
  REF_INT e1;
  REF_INT e0;
  ulong local_c8;
  REF_INT local_bc;
  REF_INT local_b8;
  REF_INT e5;
  REF_INT e4;
  REF_INT e2;
  REF_INT nodes [27];
  
  local_170 = ref_subdiv->grid->node;
  ref_cell = ref_subdiv->grid->cell[8];
  iVar13 = ref_cell->max;
  if ((long)iVar13 < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x670,
           "ref_subdiv_split_tet","malloc marked_for_removal of REF_INT negative");
    local_198 = 1;
  }
  else {
    __size = (long)iVar13 * 4;
    local_f8 = malloc(__size);
    if (local_f8 == (void *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x670,"ref_subdiv_split_tet","malloc marked_for_removal of REF_INT NULL");
      local_198 = 2;
      local_f8 = (void *)0x0;
    }
    else {
      bVar2 = true;
      if (iVar13 != 0) {
        memset(local_f8,0,__size);
      }
    }
  }
  if (bVar2) {
    uVar7 = ref_cell_create(&ref_cell_split,ref_cell->type);
    if (uVar7 == 0) {
      if (0 < ref_cell->max) {
        uVar14 = 0;
        do {
          iVar13 = (int)uVar14;
          if (ref_cell->c2n[(long)iVar13 * (long)ref_cell->size_per] != -1) {
            uVar7 = ref_subdiv_map(ref_subdiv,ref_cell,iVar13);
            uVar8 = ref_cell_nodes(ref_cell,iVar13,nodes);
            RVar4 = nodes[2];
            RVar6 = nodes[1];
            RVar9 = nodes[0];
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x675,"ref_subdiv_split_tet",(ulong)uVar8,"nodes");
              return uVar8;
            }
            if (uVar7 < 0x40) {
              uVar11 = (ulong)uVar7;
              if ((0x100010116U >> (uVar11 & 0x3f) & 1) == 0) {
                if ((0x100004000200800U >> (uVar11 & 0x3f) & 1) == 0) {
                  if (uVar11 == 0x3f) {
                    *(undefined4 *)((long)local_f8 + uVar14 * 4) = 1;
                    local_b8 = nodes[2];
                    local_bc = nodes[3];
                    local_180 = CONCAT44(local_180._4_4_,nodes[0]);
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],&e0);
                    ref_node = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6e9,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],&e1);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ea,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[3],&e2);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6eb,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],&e3);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ec,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[3],&e4);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ed,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[3],&e5);
                    RVar9 = e2;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ee,"ref_subdiv_split_tet",(ulong)uVar7,"e");
                      return uVar7;
                    }
                    local_178 = CONCAT44(local_178._4_4_,e0);
                    new_nodes[0] = e0;
                    new_nodes[1] = e2;
                    local_c8 = CONCAT44(local_c8._4_4_,e1);
                    new_nodes[2] = e1;
                    new_nodes[3] = (REF_INT)local_180;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ef,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6ef,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      local_180 = (ulong)(uint)pRVar1[new_nodes[1]];
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,local_180,(long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                             (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    RVar5 = e4;
                    RVar4 = e3;
                    new_nodes[0] = (REF_INT)local_178;
                    new_nodes[1] = e3;
                    new_nodes[2] = e4;
                    new_nodes[3] = RVar6;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f0,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f0,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      local_180 = (ulong)(uint)pRVar1[new_nodes[1]];
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,local_180,(long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                             (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    new_nodes[0] = (REF_INT)local_c8;
                    local_180 = CONCAT44(local_180._4_4_,e5);
                    new_nodes[1] = e5;
                    new_nodes[2] = RVar4;
                    new_nodes[3] = local_b8;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f1,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f1,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,(ulong)(uint)pRVar1[new_nodes[1]],(long)new_nodes[2],
                             (ulong)(uint)pRVar1[new_nodes[2]],(long)new_nodes[3],
                             (ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    new_nodes[0] = RVar9;
                    new_nodes[1] = RVar5;
                    new_nodes[2] = (REF_INT)local_180;
                    new_nodes[3] = local_bc;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f2,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f2,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,(ulong)(uint)pRVar1[new_nodes[1]],(long)new_nodes[2],
                             (ulong)(uint)pRVar1[new_nodes[2]],(long)new_nodes[3],
                             (ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    new_nodes[0] = (REF_INT)local_178;
                    new_nodes[1] = (REF_INT)local_180;
                    new_nodes[2] = (REF_INT)local_c8;
                    new_nodes[3] = RVar9;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f3,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f3,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      local_c8 = (ulong)(uint)pRVar1[new_nodes[1]];
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,local_c8,(long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                             (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    new_nodes[0] = (REF_INT)local_178;
                    new_nodes[1] = (REF_INT)local_180;
                    new_nodes[2] = RVar9;
                    new_nodes[3] = RVar5;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f4,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f4,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      local_178 = (ulong)(uint)pRVar1[new_nodes[1]];
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,local_178,(long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                             (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    local_178 = CONCAT44(local_178._4_4_,e0);
                    new_nodes[0] = e0;
                    new_nodes[1] = (REF_INT)local_180;
                    new_nodes[2] = RVar5;
                    new_nodes[3] = RVar4;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f5,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    pRVar3 = local_170;
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f5,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,(ulong)(uint)pRVar1[new_nodes[1]],(long)new_nodes[2],
                             (ulong)(uint)pRVar1[new_nodes[2]],(long)new_nodes[3],
                             (ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar3,new_nodes[0]);
                      ref_node_location(pRVar3,new_nodes[1]);
                      ref_node_location(pRVar3,new_nodes[2]);
                      ref_node_location(pRVar3,new_nodes[3]);
                      ref_node = pRVar3;
                    }
                    new_nodes[0] = (REF_INT)local_178;
                    new_nodes[1] = (REF_INT)local_180;
                    new_nodes[2] = e3;
                    new_nodes[3] = e1;
                    uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f6,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                      return uVar7;
                    }
                    uVar7 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x6f6,"ref_subdiv_split_tet",(ulong)uVar7,"edge split vol");
                      return uVar7;
                    }
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      local_180 = (ulong)(uint)pRVar1[new_nodes[1]];
                      local_178 = (ulong)(uint)pRVar1[new_nodes[2]];
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                             uVar14 & 0xffffffff,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1]
                             ,local_180,(long)new_nodes[2],local_178,(long)new_nodes[3],
                             (ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(ref_node,new_nodes[0]);
                      ref_node_location(ref_node,new_nodes[1]);
                      ref_node_location(ref_node,new_nodes[2]);
                      ref_node_location(ref_node,new_nodes[3]);
                    }
                    goto LAB_0021c188;
                  }
                  goto LAB_0021bc93;
                }
                *(undefined4 *)((long)local_f8 + uVar14 * 4) = 1;
                if (uVar7 == 0x15) {
                  nodes[2] = nodes[3];
                  nodes[3] = RVar4;
                  nodes[0] = nodes[1];
                  nodes[1] = RVar9;
                }
                else if (uVar7 == 0x26) {
                  nodes[0] = nodes[2];
                  nodes[1] = nodes[3];
                  nodes[2] = RVar9;
                  nodes[3] = RVar6;
                }
                else if (uVar7 == 0x38) {
                  nodes[0] = nodes[3];
                  nodes[3] = RVar9;
                  nodes[1] = nodes[2];
                  nodes[2] = RVar6;
                }
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                pRVar1 = new_nodes + 1;
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],pRVar1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6ad,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[2],new_nodes + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6b0,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6b1,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                  return uVar7;
                }
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[0],new_nodes);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6b7,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],new_nodes + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6ba,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6bb,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                  return uVar7;
                }
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6c1,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[1],pRVar1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6c4,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6c5,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                  return uVar7;
                }
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[0],nodes[1],new_nodes);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6cb,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[1],nodes[2],pRVar1);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6ce,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_subdiv_node_between(ref_subdiv,nodes[2],nodes[0],new_nodes + 2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x6d1,"ref_subdiv_split_tet",(ulong)uVar7,"mis");
                  return uVar7;
                }
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                uVar11 = (ulong)uVar7;
                if (uVar7 != 0) {
                  uVar12 = 0x6d2;
                  goto LAB_0021c163;
                }
              }
              else {
                if (ref_cell->edge_per < 1) {
                  cell_edge = -1;
                }
                else {
                  cell_edge = -1;
                  cell_edge_00 = 0;
                  do {
                    pRVar1 = ref_subdiv->mark;
                    RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge_00,iVar13);
                    if (pRVar1[RVar9] != 0) {
                      cell_edge = cell_edge_00;
                    }
                    cell_edge_00 = cell_edge_00 + 1;
                  } while (cell_edge_00 < ref_cell->edge_per);
                }
                if (cell_edge == -1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x684,"ref_subdiv_split_tet","edge not found");
                  return 1;
                }
                RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,iVar13);
                *(undefined4 *)((long)local_f8 + uVar14 * 4) = 1;
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                new_nodes[ref_cell->e2n[cell_edge * 2]] = ref_subdiv->node[RVar9];
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x68c,"ref_subdiv_split_tet",(ulong)uVar7,"add");
                  return uVar7;
                }
                new_nodes[0] = nodes[0];
                new_nodes[1] = nodes[1];
                new_nodes[2] = nodes[2];
                new_nodes[3] = nodes[3];
                new_nodes[ref_cell->e2n[(int)(cell_edge * 2 | 1)]] = ref_subdiv->node[RVar9];
                uVar7 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                uVar11 = (ulong)uVar7;
                if (uVar7 != 0) {
                  uVar12 = 0x691;
LAB_0021c163:
                  local_198 = (uint)uVar11;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,uVar12,"ref_subdiv_split_tet",uVar11,"add");
                }
              }
              if ((int)uVar11 != 0) {
                return local_198;
              }
            }
            else {
LAB_0021bc93:
              if (uVar7 != 0) {
                ref_subdiv_map_to_edge(uVar7);
                printf("tet %d, map %d\n",uVar14 & 0xffffffff,(ulong)uVar7);
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6fb,"ref_subdiv_split_tet",6,"map not implemented yet");
                return 6;
              }
            }
          }
LAB_0021c188:
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)ref_cell->max);
      }
      if (0 < ref_cell->max) {
        lVar15 = 0;
        do {
          if ((*(int *)((long)local_f8 + lVar15 * 4) == 1) &&
             (uVar7 = ref_cell_remove(ref_cell,(REF_INT)lVar15), uVar7 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x701,"ref_subdiv_split_tet",(ulong)uVar7,"remove");
            return uVar7;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < ref_cell->max);
      }
      if (0 < ref_cell_split->max) {
        iVar13 = 0;
        do {
          RVar10 = ref_cell_nodes(ref_cell_split,iVar13,nodes);
          if ((RVar10 == 0) &&
             (uVar7 = ref_subdiv_add_local_cell(ref_subdiv,ref_cell,nodes), uVar7 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x704,"ref_subdiv_split_tet",(ulong)uVar7,"add local");
            return uVar7;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < ref_cell_split->max);
      }
      local_198 = ref_cell_free(ref_cell_split);
      if (local_198 == 0) {
        free(local_f8);
        local_198 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x706,"ref_subdiv_split_tet",(ulong)local_198,"temp ref_cell free");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x672,"ref_subdiv_split_tet",(ulong)uVar7,"temp cell");
      local_198 = uVar7;
    }
  }
  return local_198;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  REF_INT edge, split_edge, global_edge;
  REF_INT n0, n1, n2, n3;
  REF_INT e0, e1, e2, e3, e4, e5;

  REF_INT node;
  REF_DBL volume;

  ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
        split_edge = REF_EMPTY;
        for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++)
          if (ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)))
            split_edge = edge;
        RAS(REF_EMPTY != split_edge, "edge not found");
        global_edge = ref_subdiv_c2e(ref_subdiv, ref_cell, split_edge, cell);

        marked_for_removal[cell] = 1;

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 0, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 1, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      case 11:
      case 56:
      case 38:
      case 21:
        /* orient cell for other cases */

        marked_for_removal[cell] = 1;

        if (56 == map) {
          node_swap(nodes, 0, 3);
          node_swap(nodes, 1, 2);
        }
        if (38 == map) {
          node_swap(nodes, 1, 3);
          node_swap(nodes, 0, 2);
        }
        if (21 == map) {
          node_swap(nodes, 2, 3);
          node_swap(nodes, 0, 1);
        }

        /* near node 0 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 1 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 2 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      /*
                          inode3------5------inode2
                             / \              . /
                            /   \          .   /
                           /     \      .     /
                          /       \  .       /
                         /        .\        /
                        2      1    4      3
                       /    .        \    /
                      /  .            \  /
                     /.                \/
                  inode0------0------inode1
       */
      case 63:
        marked_for_removal[cell] = 1;

        n0 = nodes[0];
        n1 = nodes[1];
        n2 = nodes[2];
        n3 = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1], &e0), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2], &e1), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3], &e2), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2], &e3), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[3], &e4), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3], &e5), "e");
        add_cell_with(e0, e2, e1, n0);
        add_cell_with(e0, e3, e4, n1);
        add_cell_with(e1, e5, e3, n2);
        add_cell_with(e2, e4, e5, n3);
        add_cell_with(e0, e5, e1, e2);
        add_cell_with(e0, e5, e2, e4);
        add_cell_with(e0, e5, e4, e3);
        add_cell_with(e0, e5, e3, e1);
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("tet %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}